

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorld.cpp
# Opt level: O2

btScalar __thiscall
btCollisionWorld::objectQuerySingleInternal::BridgeTriangleConvexcastCallback::reportHit
          (BridgeTriangleConvexcastCallback *this,btVector3 *hitNormalLocal,btVector3 *hitPointLocal
          ,btScalar hitFraction,int partId,int triangleIndex)

{
  ConvexResultCallback *pCVar1;
  btScalar extraout_XMM0_Da;
  LocalShapeInfo shapeInfo;
  LocalConvexResult convexResult;
  
  pCVar1 = this->m_resultCallback;
  if (hitFraction <= pCVar1->m_closestHitFraction) {
    convexResult.m_hitCollisionObject = this->m_collisionObject;
    convexResult.m_localShapeInfo = &shapeInfo;
    convexResult.m_hitNormalLocal.m_floats._0_8_ = *(undefined8 *)hitNormalLocal->m_floats;
    convexResult.m_hitNormalLocal.m_floats._8_8_ = *(undefined8 *)(hitNormalLocal->m_floats + 2);
    convexResult.m_hitPointLocal.m_floats[0] = hitPointLocal->m_floats[0];
    convexResult.m_hitPointLocal.m_floats[1] = hitPointLocal->m_floats[1];
    convexResult.m_hitPointLocal.m_floats[2] = hitPointLocal->m_floats[2];
    convexResult.m_hitPointLocal.m_floats[3] = hitPointLocal->m_floats[3];
    shapeInfo.m_shapePart = partId;
    shapeInfo.m_triangleIndex = triangleIndex;
    convexResult.m_hitFraction = hitFraction;
    (*pCVar1->_vptr_ConvexResultCallback[3])(pCVar1,&convexResult,1);
    hitFraction = extraout_XMM0_Da;
  }
  return hitFraction;
}

Assistant:

virtual btScalar reportHit(const btVector3& hitNormalLocal, const btVector3& hitPointLocal, btScalar hitFraction, int partId, int triangleIndex )
					{
						btCollisionWorld::LocalShapeInfo	shapeInfo;
						shapeInfo.m_shapePart = partId;
						shapeInfo.m_triangleIndex = triangleIndex;
						if (hitFraction <= m_resultCallback->m_closestHitFraction)
						{

							btCollisionWorld::LocalConvexResult convexResult
								(m_collisionObject,
								&shapeInfo,
								hitNormalLocal,
								hitPointLocal,
								hitFraction);

							bool	normalInWorldSpace = true;


							return m_resultCallback->addSingleResult(convexResult,normalInWorldSpace);
						}
						return hitFraction;
					}